

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

string * __thiscall
tinyusdz::value::pprint_value_abi_cxx11_
          (string *__return_storage_ptr__,value *this,Value *v,uint32_t indent,bool closing_brace)

{
  pointer this_00;
  bool bVar1;
  uint32_t uVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *customData;
  AssetPath *asset;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *v_00;
  Token *this_01;
  string *str;
  value_type *pvVar3;
  StringData *v_01;
  ValueBlock *pVVar4;
  ostream *poVar5;
  _anonymous_namespace_ *p_Var6;
  string local_ab8;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *local_a98;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *p_130;
  reference local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_129;
  StringData *p_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_127;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_9f0;
  Token *local_9e8;
  Token *local_9e0;
  undefined1 local_9d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  undefined1 local_9a0 [8];
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> p_126;
  Token *p_125;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *p_124;
  AssetPath *p_123;
  string local_940;
  string local_920;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *local_900;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *p_122;
  Shader *local_8d8;
  Shader *p_121;
  Material *local_8b0;
  Material *p_120;
  BlendShape *local_888;
  BlendShape *p_119;
  SkelAnimation *local_860;
  SkelAnimation *p_118;
  Skeleton *local_838;
  Skeleton *p_117;
  SkelRoot *local_810;
  SkelRoot *p_116;
  CylinderLight *local_7e8;
  CylinderLight *p_115;
  DistantLight *local_7c0;
  DistantLight *p_114;
  DiskLight *local_798;
  DiskLight *p_113;
  DomeLight *local_770;
  DomeLight *p_112;
  SphereLight *local_748;
  SphereLight *p_111;
  PointInstancer *local_720;
  PointInstancer *p_110;
  GeomCamera *local_6f8;
  GeomCamera *p_109;
  GeomNurbsCurves *local_6d0;
  GeomNurbsCurves *p_108;
  GeomBasisCurves *local_6a8;
  GeomBasisCurves *p_107;
  GeomCone *local_680;
  GeomCone *p_106;
  GeomCapsule *local_658;
  GeomCapsule *p_105;
  GeomCylinder *local_630;
  GeomCylinder *p_104;
  GeomCube *local_608;
  GeomCube *p_103;
  GeomPoints *local_5e0;
  GeomPoints *p_102;
  GeomSubset *local_5b8;
  GeomSubset *p_101;
  GeomSphere *local_590;
  GeomSphere *p_100;
  GeomMesh *local_568;
  GeomMesh *p_99;
  tinyusdz *local_540;
  Xform *p_98;
  Scope *local_518;
  Scope *p_97;
  Model *local_4f0;
  Model *p_96;
  vector<double,_std::allocator<double>_> *p_95;
  vector<float,_std::allocator<float>_> *p_94;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *p_93;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *p_92;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *p_91;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *p_90;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *p_89;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *p_88;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *p_87;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *p_86;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *p_85;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *p_84;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *p_83;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *p_82;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *p_81;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *p_80;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *p_79;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *p_78;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *p_77;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *p_76;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *p_75;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *p_74;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *p_73;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *p_72;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *p_71;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *p_70;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *p_69;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *p_68;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *p_67;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *p_66;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *p_65;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *p_64;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *p_63;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *p_62;
  vector<long,_std::allocator<long>_> *p_61;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *p_60;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> *p_59;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *p_58;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *p_57;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *p_56;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *p_55;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_54;
  vector<int,_std::allocator<int>_> *p_53;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *p_52;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *p_51;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *p_50;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *p_49;
  vector<bool,_std::allocator<bool>_> *p_48;
  double *local_348;
  double *p_47;
  float *local_320;
  float *p_46;
  texcoord3d *p_45;
  texcoord3f *p_44;
  texcoord3h *p_43;
  texcoord2d *p_42;
  texcoord2f *p_41;
  texcoord2h *p_40;
  color4d *p_39;
  color4f *p_38;
  color3d *p_37;
  color3f *p_36;
  point3d *p_35;
  point3f *p_34;
  point3h *p_33;
  vector3d *p_32;
  vector3f *p_31;
  vector3h *p_30;
  normal3d *p_29;
  normal3f *p_28;
  normal3h *p_27;
  quatd *p_26;
  quatf *p_25;
  quath *p_24;
  matrix4d *p_23;
  matrix3d *p_22;
  matrix2d *p_21;
  array<double,_4UL> *p_20;
  array<double,_3UL> *p_19;
  array<double,_2UL> *p_18;
  array<float,_4UL> *p_17;
  array<float,_3UL> *p_16;
  array<float,_2UL> *p_15;
  unsigned_long *p_14;
  long *p_13;
  array<unsigned_int,_4UL> *p_12;
  array<unsigned_int,_3UL> *p_11;
  array<unsigned_int,_2UL> *p_10;
  array<int,_4UL> *p_9;
  array<int,_3UL> *p_8;
  array<int,_2UL> *p_7;
  uint *p_6;
  int *p_5;
  array<tinyusdz::value::half,_4UL> *p_4;
  array<tinyusdz::value::half,_3UL> *p_3;
  array<tinyusdz::value::half,_2UL> *p_2;
  half *p_1;
  bool *p;
  stringstream os;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  value *pvStack_18;
  uint32_t indent_local;
  Value *v_local;
  
  local_1c = (uint)v;
  local_1d = (byte)indent & 1;
  pvStack_18 = this;
  v_local = (Value *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&p);
  uVar2 = Value::type_id((Value *)pvStack_18);
  if (uVar2 == 4) {
    pVVar4 = Value::as<tinyusdz::value::ValueBlock>((Value *)pvStack_18,false);
    if (pVVar4 == (ValueBlock *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: ValueBlock type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,"None");
    }
  }
  else if (uVar2 == 6) {
    this_01 = Value::as<tinyusdz::Token>((Value *)pvStack_18,false);
    if (this_01 == (Token *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Token type TypeId mismatch.]");
    }
    else {
      str = Token::str_abi_cxx11_(this_01);
      buildEscapedAndQuotedStringForUSDA((string *)((long)&p_126.contained + 0x10),str);
      std::operator<<(aoStack_198,(string *)((long)&p_126.contained + 0x10));
      std::__cxx11::string::~string((string *)((long)&p_126.contained + 0x10));
    }
  }
  else if (uVar2 == 7) {
    local_a08 = Value::as<std::__cxx11::string>((Value *)pvStack_18,false);
    if (local_a08 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: `string` type TypeId mismatch.]");
    }
    else {
      buildEscapedAndQuotedStringForUSDA((string *)&p_128,local_a08);
      std::operator<<(aoStack_198,(string *)&p_128);
      std::__cxx11::string::~string((string *)&p_128);
    }
  }
  else if (uVar2 == 8) {
    v_01 = Value::as<tinyusdz::value::StringData>((Value *)pvStack_18,false);
    if (v_01 == (StringData *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: `string` type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,v_01);
    }
  }
  else if (uVar2 == 9) {
    p_1 = (half *)Value::as<bool>((Value *)pvStack_18,false);
    if (p_1 == (half *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::ostream::operator<<(aoStack_198,(bool)(SUB21(p_1->value,0) & 1));
    }
  }
  else if (uVar2 == 0xe) {
    p_2 = (array<tinyusdz::value::half,_2UL> *)
          Value::as<tinyusdz::value::half>((Value *)pvStack_18,false);
    if (p_2 == (array<tinyusdz::value::half,_2UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(half *)p_2);
    }
  }
  else if (uVar2 == 0xf) {
    p_6 = (uint *)Value::as<int>((Value *)pvStack_18,false);
    if (p_6 == (uint *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::ostream::operator<<(aoStack_198,*p_6);
    }
  }
  else if (uVar2 == 0x10) {
    p_14 = (unsigned_long *)Value::as<long>((Value *)pvStack_18,false);
    if (p_14 == (unsigned_long *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::ostream::operator<<(aoStack_198,*p_14);
    }
  }
  else if (uVar2 == 0x11) {
    p_3 = (array<tinyusdz::value::half,_3UL> *)
          Value::as<std::array<tinyusdz::value::half,2ul>>((Value *)pvStack_18,false);
    if (p_3 == (array<tinyusdz::value::half,_3UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(half2 *)p_3);
    }
  }
  else if (uVar2 == 0x12) {
    p_4 = (array<tinyusdz::value::half,_4UL> *)
          Value::as<std::array<tinyusdz::value::half,3ul>>((Value *)pvStack_18,false);
    if (p_4 == (array<tinyusdz::value::half,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(half3 *)p_4);
    }
  }
  else if (uVar2 == 0x13) {
    p_5 = (int *)Value::as<std::array<tinyusdz::value::half,4ul>>((Value *)pvStack_18,false);
    if ((array<tinyusdz::value::half,_4UL> *)p_5 == (array<tinyusdz::value::half,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(half4 *)p_5);
    }
  }
  else if (uVar2 == 0x14) {
    p_8 = (array<int,_3UL> *)Value::as<std::array<int,2ul>>((Value *)pvStack_18,false);
    if (p_8 == (array<int,_3UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(int2 *)p_8);
    }
  }
  else if (uVar2 == 0x15) {
    p_9 = (array<int,_4UL> *)Value::as<std::array<int,3ul>>((Value *)pvStack_18,false);
    if (p_9 == (array<int,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(int3 *)p_9);
    }
  }
  else if (uVar2 == 0x16) {
    p_10 = (array<unsigned_int,_2UL> *)Value::as<std::array<int,4ul>>((Value *)pvStack_18,false);
    if ((array<int,_4UL> *)p_10 == (array<int,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(int4 *)p_10);
    }
  }
  else if (uVar2 == 0x1b) {
    p_7 = (array<int,_2UL> *)Value::as<unsigned_int>((Value *)pvStack_18,false);
    if (p_7 == (array<int,_2UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::ostream::operator<<(aoStack_198,p_7->_M_elems[0]);
    }
  }
  else if (uVar2 == 0x1c) {
    p_15 = (array<float,_2UL> *)Value::as<unsigned_long>((Value *)pvStack_18,false);
    if (p_15 == (array<float,_2UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::ostream::operator<<(aoStack_198,*(ulong *)p_15->_M_elems);
    }
  }
  else if (uVar2 == 0x25) {
    p_11 = (array<unsigned_int,_3UL> *)
           Value::as<std::array<unsigned_int,2ul>>((Value *)pvStack_18,false);
    if (p_11 == (array<unsigned_int,_3UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(uint2 *)p_11);
    }
  }
  else if (uVar2 == 0x26) {
    p_12 = (array<unsigned_int,_4UL> *)
           Value::as<std::array<unsigned_int,3ul>>((Value *)pvStack_18,false);
    if (p_12 == (array<unsigned_int,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(uint3 *)p_12);
    }
  }
  else if (uVar2 == 0x27) {
    p_13 = (long *)Value::as<std::array<unsigned_int,4ul>>((Value *)pvStack_18,false);
    if ((array<unsigned_int,_4UL> *)p_13 == (array<unsigned_int,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(uint4 *)p_13);
    }
  }
  else if (uVar2 == 0x28) {
    p_Var6 = (_anonymous_namespace_ *)0x0;
    local_320 = Value::as<float>((Value *)pvStack_18,false);
    if (local_320 == (float *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: TypeId mismatch(`float` expected).]");
    }
    else {
      (anonymous_namespace)::dtos_abi_cxx11_((string *)&p_47,p_Var6,*local_320);
      std::operator<<(aoStack_198,(string *)&p_47);
      std::__cxx11::string::~string((string *)&p_47);
    }
  }
  else if (uVar2 == 0x29) {
    p_16 = (array<float,_3UL> *)Value::as<std::array<float,2ul>>((Value *)pvStack_18,false);
    if (p_16 == (array<float,_3UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(float2 *)p_16);
    }
  }
  else if (uVar2 == 0x2a) {
    p_17 = (array<float,_4UL> *)Value::as<std::array<float,3ul>>((Value *)pvStack_18,false);
    if (p_17 == (array<float,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(float3 *)p_17);
    }
  }
  else if (uVar2 == 0x2b) {
    p_18 = (array<double,_2UL> *)Value::as<std::array<float,4ul>>((Value *)pvStack_18,false);
    if (p_18 == (array<double,_2UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(float4 *)p_18);
    }
  }
  else if (uVar2 == 0x2c) {
    p_Var6 = (_anonymous_namespace_ *)0x0;
    local_348 = Value::as<double>((Value *)pvStack_18,false);
    if (local_348 == (double *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: TypeId mismatch(`double` expected).]");
    }
    else {
      (anonymous_namespace)::dtos_abi_cxx11_((string *)&p_48,p_Var6,*local_348);
      std::operator<<(aoStack_198,(string *)&p_48);
      std::__cxx11::string::~string((string *)&p_48);
    }
  }
  else if (uVar2 == 0x2d) {
    p_19 = (array<double,_3UL> *)Value::as<std::array<double,2ul>>((Value *)pvStack_18,false);
    if (p_19 == (array<double,_3UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(double2 *)p_19);
    }
  }
  else if (uVar2 == 0x2e) {
    p_20 = (array<double,_4UL> *)Value::as<std::array<double,3ul>>((Value *)pvStack_18,false);
    if (p_20 == (array<double,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(double3 *)p_20);
    }
  }
  else if (uVar2 == 0x2f) {
    p_21 = (matrix2d *)Value::as<std::array<double,4ul>>((Value *)pvStack_18,false);
    if ((array<double,_4UL> *)p_21 == (array<double,_4UL> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(double4 *)p_21);
    }
  }
  else if (uVar2 == 0x30) {
    p_25 = (quatf *)Value::as<tinyusdz::value::quath>((Value *)pvStack_18,false);
    if (p_25 == (quatf *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(quath *)p_25);
    }
  }
  else if (uVar2 == 0x31) {
    p_26 = (quatd *)Value::as<tinyusdz::value::quatf>((Value *)pvStack_18,false);
    if (p_26 == (quatd *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(quatf *)p_26);
    }
  }
  else if (uVar2 == 0x32) {
    p_27 = (normal3h *)Value::as<tinyusdz::value::quatd>((Value *)pvStack_18,false);
    if ((quatd *)p_27 == (quatd *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(quatd *)p_27);
    }
  }
  else if (uVar2 == 0x36) {
    p_22 = (matrix3d *)Value::as<tinyusdz::value::matrix2d>((Value *)pvStack_18,false);
    if (p_22 == (matrix3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(matrix2d *)p_22);
    }
  }
  else if (uVar2 == 0x37) {
    p_23 = (matrix4d *)Value::as<tinyusdz::value::matrix3d>((Value *)pvStack_18,false);
    if (p_23 == (matrix4d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(matrix3d *)p_23);
    }
  }
  else if (uVar2 == 0x38) {
    p_24 = (quath *)Value::as<tinyusdz::value::matrix4d>((Value *)pvStack_18,false);
    if (p_24 == (quath *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(matrix4d *)p_24);
    }
  }
  else if (uVar2 == 0x3a) {
    p_37 = (color3d *)Value::as<tinyusdz::value::color3f>((Value *)pvStack_18,false);
    if (p_37 == (color3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(color3f *)p_37);
    }
  }
  else if (uVar2 == 0x3b) {
    p_38 = (color4f *)Value::as<tinyusdz::value::color3d>((Value *)pvStack_18,false);
    if ((color3d *)p_38 == (color3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(color3d *)p_38);
    }
  }
  else if (uVar2 == 0x3d) {
    p_39 = (color4d *)Value::as<tinyusdz::value::color4f>((Value *)pvStack_18,false);
    if (p_39 == (color4d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(color4f *)p_39);
    }
  }
  else if (uVar2 == 0x3e) {
    p_40 = (texcoord2h *)Value::as<tinyusdz::value::color4d>((Value *)pvStack_18,false);
    if ((color4d *)p_40 == (color4d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(color4d *)p_40);
    }
  }
  else if (uVar2 == 0x3f) {
    p_34 = (point3f *)Value::as<tinyusdz::value::point3h>((Value *)pvStack_18,false);
    if (p_34 == (point3f *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(point3h *)p_34);
    }
  }
  else if (uVar2 == 0x40) {
    p_35 = (point3d *)Value::as<tinyusdz::value::point3f>((Value *)pvStack_18,false);
    if (p_35 == (point3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(point3f *)p_35);
    }
  }
  else if (uVar2 == 0x41) {
    p_36 = (color3f *)Value::as<tinyusdz::value::point3d>((Value *)pvStack_18,false);
    if ((point3d *)p_36 == (point3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(point3d *)p_36);
    }
  }
  else if (uVar2 == 0x42) {
    p_28 = (normal3f *)Value::as<tinyusdz::value::normal3h>((Value *)pvStack_18,false);
    if (p_28 == (normal3f *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(normal3h *)p_28);
    }
  }
  else if (uVar2 == 0x43) {
    p_29 = (normal3d *)Value::as<tinyusdz::value::normal3f>((Value *)pvStack_18,false);
    if (p_29 == (normal3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(normal3f *)p_29);
    }
  }
  else if (uVar2 == 0x44) {
    p_30 = (vector3h *)Value::as<tinyusdz::value::normal3d>((Value *)pvStack_18,false);
    if ((normal3d *)p_30 == (normal3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(normal3d *)p_30);
    }
  }
  else if (uVar2 == 0x45) {
    p_31 = (vector3f *)Value::as<tinyusdz::value::vector3h>((Value *)pvStack_18,false);
    if (p_31 == (vector3f *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector3h *)p_31);
    }
  }
  else if (uVar2 == 0x46) {
    p_32 = (vector3d *)Value::as<tinyusdz::value::vector3f>((Value *)pvStack_18,false);
    if (p_32 == (vector3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector3f *)p_32);
    }
  }
  else if (uVar2 == 0x47) {
    p_33 = (point3h *)Value::as<tinyusdz::value::vector3d>((Value *)pvStack_18,false);
    if ((vector3d *)p_33 == (vector3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector3d *)p_33);
    }
  }
  else if (uVar2 == 0x49) {
    p_41 = (texcoord2f *)Value::as<tinyusdz::value::texcoord2h>((Value *)pvStack_18,false);
    if (p_41 == (texcoord2f *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord2h *)p_41);
    }
  }
  else if (uVar2 == 0x4a) {
    p_42 = (texcoord2d *)Value::as<tinyusdz::value::texcoord2f>((Value *)pvStack_18,false);
    if (p_42 == (texcoord2d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord2f *)p_42);
    }
  }
  else if (uVar2 == 0x4b) {
    p_43 = (texcoord3h *)Value::as<tinyusdz::value::texcoord2d>((Value *)pvStack_18,false);
    if ((texcoord2d *)p_43 == (texcoord2d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord2d *)p_43);
    }
  }
  else if (uVar2 == 0x4c) {
    p_44 = (texcoord3f *)Value::as<tinyusdz::value::texcoord3h>((Value *)pvStack_18,false);
    if (p_44 == (texcoord3f *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord3h *)p_44);
    }
  }
  else if (uVar2 == 0x4d) {
    p_45 = (texcoord3d *)Value::as<tinyusdz::value::texcoord3f>((Value *)pvStack_18,false);
    if (p_45 == (texcoord3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord3f *)p_45);
    }
  }
  else if (uVar2 == 0x4e) {
    p_46 = (float *)Value::as<tinyusdz::value::texcoord3d>((Value *)pvStack_18,false);
    if ((texcoord3d *)p_46 == (texcoord3d *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Base type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(texcoord3d *)p_46);
    }
  }
  else if (uVar2 == 0x51) {
    asset = Value::as<tinyusdz::value::AssetPath>((Value *)pvStack_18,false);
    if (asset == (AssetPath *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: asset type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,asset);
    }
  }
  else if (uVar2 == 0x53) {
    customData = Value::
                 as<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                           ((Value *)pvStack_18,false);
    local_900 = customData;
    if (customData ==
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
         *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Dict type TypeId mismatch.]");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_940,"",(allocator *)((long)&p_123 + 7));
      print_customData(&local_920,customData,&local_940,local_1c);
      std::operator<<(aoStack_198,(string *)&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_940);
      std::allocator<char>::~allocator((allocator<char> *)((long)&p_123 + 7));
    }
  }
  else if (uVar2 == 0x66) {
    Value::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               &vs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Value *)pvStack_18,false);
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_0>
              ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               local_9a0,
               (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               &vs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                &vs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_9d8);
      pvVar3 = nonstd::optional_lite::
               optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::operator->
                         ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                           *)local_9a0);
      local_9e0 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                                     (pvVar3);
      pvVar3 = nonstd::optional_lite::
               optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::operator->
                         ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                           *)local_9a0);
      local_9e8 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                                     (pvVar3);
      local_9f0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_9d8);
      p_127 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              transform<__gnu_cxx::__normal_iterator<tinyusdz::Token*,std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,tinyusdz::value::pprint_value(tinyusdz::value::Value_const&,unsigned_int,bool)::__0>
                        (local_9e0,local_9e8,local_9f0);
      std::operator<<(aoStack_198,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_9d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_9d8);
    }
    else {
      std::operator<<(aoStack_198,"[InternalError: `token[]` type TypeId mismatch.]");
    }
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                local_9a0);
  }
  else if (uVar2 == 0x401) {
    local_4f0 = Value::as<tinyusdz::Model>((Value *)pvStack_18,false);
    if (local_4f0 == (Model *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_97,(tinyusdz *)local_4f0,(Model *)(ulong)local_1c,(uint)(local_1d & 1)
                 ,closing_brace);
      std::operator<<(aoStack_198,(string *)&p_97);
      std::__cxx11::string::~string((string *)&p_97);
    }
  }
  else if (uVar2 == 0x402) {
    local_518 = Value::as<tinyusdz::Scope>((Value *)pvStack_18,false);
    if (local_518 == (Scope *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_98,(tinyusdz *)local_518,(Scope *)(ulong)local_1c,(uint)(local_1d & 1)
                 ,closing_brace);
      std::operator<<(aoStack_198,(string *)&p_98);
      std::__cxx11::string::~string((string *)&p_98);
    }
  }
  else if (uVar2 == 0x404) {
    local_540 = (tinyusdz *)Value::as<tinyusdz::Xform>((Value *)pvStack_18,false);
    if (local_540 == (tinyusdz *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_99,local_540,(Xform *)(ulong)local_1c,(uint)(local_1d & 1),
                 closing_brace);
      std::operator<<(aoStack_198,(string *)&p_99);
      std::__cxx11::string::~string((string *)&p_99);
    }
  }
  else if (uVar2 == 0x405) {
    local_568 = Value::as<tinyusdz::GeomMesh>((Value *)pvStack_18,false);
    if (local_568 == (GeomMesh *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_100,(tinyusdz *)local_568,(GeomMesh *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_100);
      std::__cxx11::string::~string((string *)&p_100);
    }
  }
  else if (uVar2 == 0x406) {
    local_6a8 = Value::as<tinyusdz::GeomBasisCurves>((Value *)pvStack_18,false);
    if (local_6a8 == (GeomBasisCurves *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_108,(tinyusdz *)local_6a8,(GeomBasisCurves *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_108);
      std::__cxx11::string::~string((string *)&p_108);
    }
  }
  else if (uVar2 == 0x407) {
    local_6d0 = Value::as<tinyusdz::GeomNurbsCurves>((Value *)pvStack_18,false);
    if (local_6d0 == (GeomNurbsCurves *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_109,(tinyusdz *)local_6d0,(GeomNurbsCurves *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_109);
      std::__cxx11::string::~string((string *)&p_109);
    }
  }
  else if (uVar2 == 0x408) {
    local_590 = Value::as<tinyusdz::GeomSphere>((Value *)pvStack_18,false);
    if (local_590 == (GeomSphere *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_101,(tinyusdz *)local_590,(GeomSphere *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_101);
      std::__cxx11::string::~string((string *)&p_101);
    }
  }
  else if (uVar2 == 0x409) {
    local_608 = Value::as<tinyusdz::GeomCube>((Value *)pvStack_18,false);
    if (local_608 == (GeomCube *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_104,(tinyusdz *)local_608,(GeomCube *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_104);
      std::__cxx11::string::~string((string *)&p_104);
    }
  }
  else if (uVar2 == 0x40a) {
    local_630 = Value::as<tinyusdz::GeomCylinder>((Value *)pvStack_18,false);
    if (local_630 == (GeomCylinder *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_105,(tinyusdz *)local_630,(GeomCylinder *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_105);
      std::__cxx11::string::~string((string *)&p_105);
    }
  }
  else if (uVar2 == 0x40b) {
    local_680 = Value::as<tinyusdz::GeomCone>((Value *)pvStack_18,false);
    if (local_680 == (GeomCone *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_107,(tinyusdz *)local_680,(GeomCone *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_107);
      std::__cxx11::string::~string((string *)&p_107);
    }
  }
  else if (uVar2 == 0x40c) {
    local_658 = Value::as<tinyusdz::GeomCapsule>((Value *)pvStack_18,false);
    if (local_658 == (GeomCapsule *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_106,(tinyusdz *)local_658,(GeomCapsule *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_106);
      std::__cxx11::string::~string((string *)&p_106);
    }
  }
  else if (uVar2 == 0x40d) {
    local_5e0 = Value::as<tinyusdz::GeomPoints>((Value *)pvStack_18,false);
    if (local_5e0 == (GeomPoints *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_103,(tinyusdz *)local_5e0,(GeomPoints *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_103);
      std::__cxx11::string::~string((string *)&p_103);
    }
  }
  else if (uVar2 == 0x40e) {
    local_5b8 = Value::as<tinyusdz::GeomSubset>((Value *)pvStack_18,false);
    if (local_5b8 == (GeomSubset *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_102,(tinyusdz *)local_5b8,(GeomSubset *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_102);
      std::__cxx11::string::~string((string *)&p_102);
    }
  }
  else if (uVar2 == 0x40f) {
    local_720 = Value::as<tinyusdz::PointInstancer>((Value *)pvStack_18,false);
    if (local_720 == (PointInstancer *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_111,(tinyusdz *)local_720,(PointInstancer *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_111);
      std::__cxx11::string::~string((string *)&p_111);
    }
  }
  else if (uVar2 == 0x410) {
    local_6f8 = Value::as<tinyusdz::GeomCamera>((Value *)pvStack_18,false);
    if (local_6f8 == (GeomCamera *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_110,(tinyusdz *)local_6f8,(GeomCamera *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_110);
      std::__cxx11::string::~string((string *)&p_110);
    }
  }
  else if (uVar2 == 0x601) {
    local_748 = Value::as<tinyusdz::SphereLight>((Value *)pvStack_18,false);
    if (local_748 == (SphereLight *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_112,(tinyusdz *)local_748,(SphereLight *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_112);
      std::__cxx11::string::~string((string *)&p_112);
    }
  }
  else if (uVar2 == 0x602) {
    local_770 = Value::as<tinyusdz::DomeLight>((Value *)pvStack_18,false);
    if (local_770 == (DomeLight *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_113,(tinyusdz *)local_770,(DomeLight *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_113);
      std::__cxx11::string::~string((string *)&p_113);
    }
  }
  else if (uVar2 == 0x603) {
    local_7e8 = Value::as<tinyusdz::CylinderLight>((Value *)pvStack_18,false);
    if (local_7e8 == (CylinderLight *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_116,(tinyusdz *)local_7e8,(CylinderLight *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_116);
      std::__cxx11::string::~string((string *)&p_116);
    }
  }
  else if (uVar2 == 0x604) {
    local_798 = Value::as<tinyusdz::DiskLight>((Value *)pvStack_18,false);
    if (local_798 == (DiskLight *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_114,(tinyusdz *)local_798,(DiskLight *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_114);
      std::__cxx11::string::~string((string *)&p_114);
    }
  }
  else if (uVar2 == 0x606) {
    local_7c0 = Value::as<tinyusdz::DistantLight>((Value *)pvStack_18,false);
    if (local_7c0 == (DistantLight *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_115,(tinyusdz *)local_7c0,(DistantLight *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_115);
      std::__cxx11::string::~string((string *)&p_115);
    }
  }
  else if (uVar2 == 0x801) {
    local_8d8 = Value::as<tinyusdz::Shader>((Value *)pvStack_18,false);
    if (local_8d8 == (Shader *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_122,(tinyusdz *)local_8d8,(Shader *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_122);
      std::__cxx11::string::~string((string *)&p_122);
    }
  }
  else if (uVar2 == 0x802) {
    local_8b0 = Value::as<tinyusdz::Material>((Value *)pvStack_18,false);
    if (local_8b0 == (Material *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_121,(tinyusdz *)local_8b0,(Material *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_121);
      std::__cxx11::string::~string((string *)&p_121);
    }
  }
  else if (uVar2 == 0x2001) {
    local_810 = Value::as<tinyusdz::SkelRoot>((Value *)pvStack_18,false);
    if (local_810 == (SkelRoot *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_117,(tinyusdz *)local_810,(SkelRoot *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_117);
      std::__cxx11::string::~string((string *)&p_117);
    }
  }
  else if (uVar2 == 0x2002) {
    local_838 = Value::as<tinyusdz::Skeleton>((Value *)pvStack_18,false);
    if (local_838 == (Skeleton *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_118,(tinyusdz *)local_838,(Skeleton *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_118);
      std::__cxx11::string::~string((string *)&p_118);
    }
  }
  else if (uVar2 == 0x2003) {
    local_860 = Value::as<tinyusdz::SkelAnimation>((Value *)pvStack_18,false);
    if (local_860 == (SkelAnimation *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_119,(tinyusdz *)local_860,(SkelAnimation *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_119);
      std::__cxx11::string::~string((string *)&p_119);
    }
  }
  else if (uVar2 == 0x2004) {
    local_888 = Value::as<tinyusdz::BlendShape>((Value *)pvStack_18,false);
    if (local_888 == (BlendShape *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: Prim type TypeId mismatch.]");
    }
    else {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&p_120,(tinyusdz *)local_888,(BlendShape *)(ulong)local_1c,
                 (uint)(local_1d & 1),closing_brace);
      std::operator<<(aoStack_198,(string *)&p_120);
      std::__cxx11::string::~string((string *)&p_120);
    }
  }
  else if (uVar2 == 0x100007) {
    ss.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Value::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((Value *)pvStack_18,false);
    if (ss.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      std::operator<<(aoStack_198,"[InternalError: `string[]` type TypeId mismatch.]");
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range4);
      this_00 = ss.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ss.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&item), bVar1) {
        local_a70 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4);
        buildEscapedAndQuotedStringForUSDA((string *)&p_130,local_a70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range4,(value_type *)&p_130);
        std::__cxx11::string::~string((string *)&p_130);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
      std::operator<<(aoStack_198,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range4);
    }
  }
  else if (uVar2 == 0x100008) {
    local_a98 = Value::
                as<std::vector<tinyusdz::value::StringData,std::allocator<tinyusdz::value::StringData>>>
                          ((Value *)pvStack_18,false);
    if (local_a98 ==
        (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: `string[]` type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,local_a98);
    }
  }
  else if (uVar2 == 0x100009) {
    p_49 = (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
           Value::as<std::vector<bool,std::allocator<bool>>>((Value *)pvStack_18,false);
    if ((vector<bool,_std::allocator<bool>_> *)p_49 == (vector<bool,_std::allocator<bool>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector<bool,_std::allocator<bool>_> *)p_49);
    }
  }
  else if (uVar2 == 0x10000e) {
    p_50 = (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
            *)Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                        ((Value *)pvStack_18,false);
    if (p_50 == (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                 *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)p_50)
      ;
    }
  }
  else if (uVar2 == 0x10000f) {
    p_54 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           Value::as<std::vector<int,std::allocator<int>>>((Value *)pvStack_18,false);
    if ((vector<int,_std::allocator<int>_> *)p_54 == (vector<int,_std::allocator<int>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector<int,_std::allocator<int>_> *)p_54);
    }
  }
  else if (uVar2 == 0x100010) {
    p_62 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           Value::as<std::vector<long,std::allocator<long>>>((Value *)pvStack_18,false);
    if ((vector<long,_std::allocator<long>_> *)p_62 == (vector<long,_std::allocator<long>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector<long,_std::allocator<long>_> *)p_62);
    }
  }
  else if (uVar2 == 0x100011) {
    p_51 = (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            *)Value::
              as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                        ((Value *)pvStack_18,false);
    if ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
         *)p_51 ==
        (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
         *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)p_51);
    }
  }
  else if (uVar2 == 0x100012) {
    p_52 = (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
            *)Value::
              as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                        ((Value *)pvStack_18,false);
    if ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
         *)p_52 ==
        (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
         *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)p_52);
    }
  }
  else if (uVar2 == 0x100013) {
    p_53 = (vector<int,_std::allocator<int>_> *)
           Value::
           as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                     ((Value *)pvStack_18,false);
    if (p_53 == (vector<int,_std::allocator<int>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)p_53);
    }
  }
  else if (uVar2 == 0x100014) {
    p_56 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
           Value::as<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)p_56 ==
        (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)p_56);
    }
  }
  else if (uVar2 == 0x100015) {
    p_57 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
           Value::as<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)p_57 ==
        (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)p_57);
    }
  }
  else if (uVar2 == 0x100016) {
    p_58 = (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *
           )Value::as<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                      ((Value *)pvStack_18,false);
    if ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)p_58 ==
        (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)p_58);
    }
  }
  else if (uVar2 == 0x10001b) {
    p_55 = (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
           Value::as<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                     ((Value *)pvStack_18,false);
    if (p_55 == (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_55);
    }
  }
  else if (uVar2 == 0x10001c) {
    p_63 = (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
           Value::as<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     ((Value *)pvStack_18,false);
    if (p_63 == (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_63);
    }
  }
  else if (uVar2 == 0x100025) {
    p_59 = (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> *
           )Value::
            as<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                      ((Value *)pvStack_18,false);
    if ((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *)
        p_59 == (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                       *)p_59);
    }
  }
  else if (uVar2 == 0x100026) {
    p_60 = (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *
           )Value::
            as<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                      ((Value *)pvStack_18,false);
    if ((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> *)
        p_60 == (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                 *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                       *)p_60);
    }
  }
  else if (uVar2 == 0x100027) {
    p_61 = (vector<long,_std::allocator<long>_> *)
           Value::
           as<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                     ((Value *)pvStack_18,false);
    if (p_61 == (vector<long,_std::allocator<long>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                       *)p_61);
    }
  }
  else if (uVar2 == 0x100028) {
    p_95 = (vector<double,_std::allocator<double>_> *)
           Value::as<std::vector<float,std::allocator<float>>>((Value *)pvStack_18,false);
    if (p_95 == (vector<double,_std::allocator<double>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: TypeId mismatch(`float[]` expected).]");
    }
    else {
      std::operator<<(aoStack_198,(vector<float,_std::allocator<float>_> *)p_95);
    }
  }
  else if (uVar2 == 0x100029) {
    p_64 = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
           Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)p_64 ==
        (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                      p_64);
    }
  }
  else if (uVar2 == 0x10002a) {
    p_65 = (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
           Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)p_65 ==
        (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      p_65);
    }
  }
  else if (uVar2 == 0x10002b) {
    p_66 = (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
           Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                     ((Value *)pvStack_18,false);
    if (p_66 == (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      p_66);
    }
  }
  else if (uVar2 == 0x10002c) {
    p_96 = (Model *)Value::as<std::vector<double,std::allocator<double>>>((Value *)pvStack_18,false)
    ;
    if (p_96 == (Model *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: TypeId mismatch(`double[]` expected).]");
    }
    else {
      std::operator<<(aoStack_198,(vector<double,_std::allocator<double>_> *)p_96);
    }
  }
  else if (uVar2 == 0x10002d) {
    p_67 = (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
           Value::as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)p_67 ==
        (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      p_67);
    }
  }
  else if (uVar2 == 0x10002e) {
    p_68 = (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
           Value::as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)p_68 ==
        (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      p_68);
    }
  }
  else if (uVar2 == 0x10002f) {
    p_69 = (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
           Value::as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                     ((Value *)pvStack_18,false);
    if ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)p_69 ==
        (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                      p_69);
    }
  }
  else if (uVar2 == 0x100030) {
    p_73 = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
           Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                     ((Value *)pvStack_18,false);
    if (p_73 == (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                      p_73);
    }
  }
  else if (uVar2 == 0x100031) {
    p_74 = (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
           Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                     ((Value *)pvStack_18,false);
    if (p_74 == (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      p_74);
    }
  }
  else if (uVar2 == 0x100032) {
    p_75 = (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
           Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                     ((Value *)pvStack_18,false);
    if (p_75 == (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)0x0
       ) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                      p_75);
    }
  }
  else if (uVar2 == 0x100036) {
    p_70 = (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
           Value::
           as<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)p_70 ==
        (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       *)p_70);
    }
  }
  else if (uVar2 == 0x100037) {
    p_71 = (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
           Value::
           as<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)p_71 ==
        (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       *)p_71);
    }
  }
  else if (uVar2 == 0x100038) {
    p_72 = (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
           Value::
           as<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)p_72 ==
        (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)p_72);
    }
  }
  else if (uVar2 == 0x10003a) {
    p_85 = (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
           Value::as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                     ((Value *)pvStack_18,false);
    if (p_85 == (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
                      )p_85);
    }
  }
  else if (uVar2 == 0x10003b) {
    p_86 = (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
           Value::as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)p_86 ==
        (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *
                      )p_86);
    }
  }
  else if (uVar2 == 0x10003d) {
    p_87 = (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
           Value::as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                     ((Value *)pvStack_18,false);
    if (p_87 == (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
                      )p_87);
    }
  }
  else if (uVar2 == 0x10003e) {
    p_88 = (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
           Value::as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)p_88 ==
        (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
                      )p_88);
    }
  }
  else if (uVar2 == 0x10003f) {
    p_82 = (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
           Value::as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                     ((Value *)pvStack_18,false);
    if (p_82 == (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
                      )p_82);
    }
  }
  else if (uVar2 == 0x100040) {
    p_83 = (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
           Value::as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                     ((Value *)pvStack_18,false);
    if (p_83 == (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                      )p_83);
    }
  }
  else if (uVar2 == 0x100041) {
    p_84 = (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
           Value::as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                     ((Value *)pvStack_18,false);
    if (p_84 == (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
                      )p_84);
    }
  }
  else if (uVar2 == 0x100042) {
    p_76 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
           Value::
           as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                     ((Value *)pvStack_18,false);
    if (p_76 == (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)0x0
       ) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)p_76);
    }
  }
  else if (uVar2 == 0x100043) {
    p_77 = (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
           Value::
           as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                     ((Value *)pvStack_18,false);
    if (p_77 == (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)0x0
       ) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)p_77);
    }
  }
  else if (uVar2 == 0x100044) {
    p_78 = (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
           Value::
           as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)p_78 ==
        (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)p_78);
    }
  }
  else if (uVar2 == 0x100045) {
    p_79 = (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
           Value::
           as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                     ((Value *)pvStack_18,false);
    if (p_79 == (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)0x0
       ) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)p_79);
    }
  }
  else if (uVar2 == 0x100046) {
    p_80 = (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
           Value::
           as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                     ((Value *)pvStack_18,false);
    if (p_80 == (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)0x0
       ) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)p_80);
    }
  }
  else if (uVar2 == 0x100047) {
    p_81 = (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
           Value::
           as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                     ((Value *)pvStack_18,false);
    if (p_81 == (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)0x0)
    {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)p_81);
    }
  }
  else if (uVar2 == 0x100049) {
    p_89 = (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                     ((Value *)pvStack_18,false);
    if (p_89 == (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *
                )0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)p_89);
    }
  }
  else if (uVar2 == 0x10004a) {
    p_90 = (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                     ((Value *)pvStack_18,false);
    if (p_90 == (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *
                )0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)p_90);
    }
  }
  else if (uVar2 == 0x10004b) {
    p_91 = (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                     ((Value *)pvStack_18,false);
    if ((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)p_91 ==
        (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)p_91);
    }
  }
  else if (uVar2 == 0x10004c) {
    p_92 = (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                     ((Value *)pvStack_18,false);
    if (p_92 == (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
                )0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)p_92);
    }
  }
  else if (uVar2 == 0x10004d) {
    p_93 = (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                     ((Value *)pvStack_18,false);
    if (p_93 == (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *
                )0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)p_93);
    }
  }
  else if (uVar2 == 0x10004e) {
    p_94 = (vector<float,_std::allocator<float>_> *)
           Value::
           as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                     ((Value *)pvStack_18,false);
    if (p_94 == (vector<float,_std::allocator<float>_> *)0x0) {
      std::operator<<(aoStack_198,"[InternalError: 1D type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)p_94);
    }
  }
  else if (uVar2 == 0x100051) {
    v_00 = Value::
           as<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                     ((Value *)pvStack_18,false);
    if (v_00 == (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                0x0) {
      std::operator<<(aoStack_198,"[InternalError: asset[] type TypeId mismatch.]");
    }
    else {
      std::operator<<(aoStack_198,v_00);
    }
  }
  else {
    poVar5 = std::operator<<(aoStack_198,"VALUE_PPRINT: TODO: (type: ");
    Value::type_name_abi_cxx11_(&local_ab8,(Value *)pvStack_18);
    poVar5 = std::operator<<(poVar5,(string *)&local_ab8);
    std::operator<<(poVar5,") ");
    std::__cxx11::string::~string((string *)&local_ab8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&p);
  return __return_storage_ptr__;
}

Assistant:

std::string pprint_value(const value::Value &v, const uint32_t indent,
                         bool closing_brace) {
#define BASETYPE_CASE_EXPR(__ty)                           \
  case TypeTraits<__ty>::type_id(): {                      \
    auto p = v.as<__ty>();                                 \
    if (p) {                                               \
      os << (*p);                                          \
    } else {                                               \
      os << "[InternalError: Base type TypeId mismatch.]"; \
    }                                                      \
    break;                                                 \
  }

#define PRIMTYPE_CASE_EXPR(__ty)                           \
  case TypeTraits<__ty>::type_id(): {                      \
    auto p = v.as<__ty>();                                 \
    if (p) {                                               \
      os << to_string(*p, indent, closing_brace);          \
    } else {                                               \
      os << "[InternalError: Prim type TypeId mismatch.]"; \
    }                                                      \
    break;                                                 \
  }

#define ARRAY1DTYPE_CASE_EXPR(__ty)                      \
  case TypeTraits<std::vector<__ty>>::type_id(): {       \
    auto p = v.as<std::vector<__ty>>();                  \
    if (p) {                                             \
      os << (*p);                                        \
    } else {                                             \
      os << "[InternalError: 1D type TypeId mismatch.]"; \
    }                                                    \
    break;                                               \
  }

  std::stringstream os;

  switch (v.type_id()) {
    // base type
    CASE_EXPR_LIST(BASETYPE_CASE_EXPR)

    case TypeTraits<float>::type_id(): {
      auto p = v.as<float>();
      if (p) {
        os << dtos(*p);
      } else {
        os << "[InternalError: TypeId mismatch(`float` expected).]";
      }
      break;
    }

    case TypeTraits<double>::type_id(): {
      auto p = v.as<double>();
      if (p) {
        os << dtos(*p);
      } else {
        os << "[InternalError: TypeId mismatch(`double` expected).]";
      }
      break;
    }

      // 1D array
      CASE_EXPR_LIST(ARRAY1DTYPE_CASE_EXPR)

    case TypeTraits<std::vector<float>>::type_id(): {
      auto p = v.as<std::vector<float>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: TypeId mismatch(`float[]` expected).]";
      }
      break;
    }

    case TypeTraits<std::vector<double>>::type_id(): {
      auto p = v.as<std::vector<double>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: TypeId mismatch(`double[]` expected).]";
      }
      break;
    }

      // 2D array
      // CASE_EXPR_LIST(ARRAY2DTYPE_CASE_EXPR)

      // GPrim
      CASE_GPRIM_LIST(PRIMTYPE_CASE_EXPR)

    // dict and customData
    case TypeTraits<CustomDataType>::type_id(): {
      auto p = v.as<CustomDataType>();
      if (p) {
        os << print_customData(*p, "", indent);
      } else {
        os << "[InternalError: Dict type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::AssetPath>::type_id(): {
      auto p = v.as<value::AssetPath>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: asset type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::AssetPath>>::type_id(): {
      auto p = v.as<std::vector<value::AssetPath>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: asset[] type TypeId mismatch.]";
      }
      break;
    }

    case TypeTraits<value::token>::type_id(): {
      auto p = v.as<value::token>();
      if (p) {
        os << buildEscapedAndQuotedStringForUSDA(p->str());
      } else {
        os << "[InternalError: Token type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::token>>::type_id(): {
      auto p = v.get_value<std::vector<value::token>>();
      if (p) {
        std::vector<std::string> vs;
        std::transform(p->begin(), p->end(), std::back_inserter(vs),
                       [](const value::token &tok) {
                         return buildEscapedAndQuotedStringForUSDA(tok.str());
                       });

        os << vs;
      } else {
        os << "[InternalError: `token[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::string>::type_id(): {
      auto p = v.as<std::string>();
      if (p) {
        os << buildEscapedAndQuotedStringForUSDA(*p);
      } else {
        os << "[InternalError: `string` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::StringData>::type_id(): {
      auto p = v.as<value::StringData>();
      if (p) {
        os << (*p);  // FIXME: Call buildEscapedAndQuotedStringForUSDA() here?
      } else {
        os << "[InternalError: `string` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<std::string>>::type_id(): {
      auto p = v.as<std::vector<std::string>>();
      if (p) {
        std::vector<std::string> ss;
        for (const auto &item : *p) {
          ss.push_back(buildEscapedAndQuotedStringForUSDA(item));
        }
        os << ss;  // Use operator<<(std::vector<std::string>)
      } else {
        os << "[InternalError: `string[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::StringData>>::type_id(): {
      auto p = v.as<std::vector<value::StringData>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: `string[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::ValueBlock>::type_id(): {
      if (v.as<value::ValueBlock>()) {
        os << "None";
      } else {
        os << "[InternalError: ValueBlock type TypeId mismatch.]";
      }
      break;
    }
    // TODO: List-up all case and remove `default` clause.
    default: {
      os << "VALUE_PPRINT: TODO: (type: " << v.type_name() << ") ";
    }
  }

#undef BASETYPE_CASE_EXPR
#undef PRIMTYPE_CASE_EXPR
#undef ARRAY1DTYPE_CASE_EXPR
#undef ARRAY2DTYPE_CASE_EXPR

  return os.str();
}